

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O1

SRes crnlib::LzmaDec_DecodeToDic
               (CLzmaDec *p,SizeT dicLimit,Byte *src,SizeT *srcLen,ELzmaFinishMode finishMode,
               ELzmaStatus *status)

{
  Byte *buf;
  Byte BVar1;
  UInt16 *pUVar2;
  Byte *pBVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ELzmaDummy EVar7;
  int iVar8;
  ELzmaStatus EVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Byte *pBVar14;
  ELzmaStatus *pEVar15;
  SizeT inSize;
  bool bVar16;
  undefined1 auVar17 [16];
  int iVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar37;
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  undefined1 auVar39 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  uint local_6c;
  Byte *local_48;
  
  inSize = *srcLen;
  *srcLen = 0;
  pEVar15 = status;
  LzmaDec_WriteRem(p,dicLimit);
  *status = LZMA_STATUS_NOT_SPECIFIED;
  buf = p->tempBuf;
  auVar45 = _DAT_001b10b0;
  do {
    if (p->remainLen == 0x112) {
      if (p->code == 0) {
        *status = LZMA_STATUS_FINISHED_WITH_MARK;
      }
      return (uint)(p->code != 0);
    }
    local_6c = (uint)pEVar15;
    if (p->needFlush == 0) {
LAB_001a71dd:
      uVar11 = p->dicPos;
      if (uVar11 < dicLimit) {
LAB_001a7219:
        if (p->needInitState != 0) {
          uVar6 = 0x300 << ((char)(p->prop).lp + (char)(p->prop).lc & 0x1fU);
          pUVar2 = p->probs;
          lVar10 = (ulong)uVar6 + 0x735;
          auVar17._8_4_ = (int)lVar10;
          auVar17._0_8_ = lVar10;
          auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
          auVar17 = auVar17 ^ auVar45;
          uVar12 = 0;
          auVar19 = _DAT_001b10a0;
          auVar20 = _DAT_001b1090;
          auVar21 = _DAT_001b1080;
          auVar22 = _DAT_001b1070;
          do {
            auVar23 = auVar19 ^ auVar45;
            iVar37 = auVar17._0_4_;
            iVar36 = -(uint)(iVar37 < auVar23._0_4_);
            iVar8 = auVar17._4_4_;
            auVar24._4_4_ = -(uint)(iVar8 < auVar23._4_4_);
            iVar41 = auVar17._8_4_;
            iVar40 = -(uint)(iVar41 < auVar23._8_4_);
            iVar18 = auVar17._12_4_;
            auVar24._12_4_ = -(uint)(iVar18 < auVar23._12_4_);
            auVar33._4_4_ = iVar36;
            auVar33._0_4_ = iVar36;
            auVar33._8_4_ = iVar40;
            auVar33._12_4_ = iVar40;
            auVar42 = pshuflw(in_XMM8,auVar33,0xe8);
            auVar26._4_4_ = -(uint)(auVar23._4_4_ == iVar8);
            auVar26._12_4_ = -(uint)(auVar23._12_4_ == iVar18);
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._12_4_;
            auVar44 = pshuflw(in_XMM9,auVar26,0xe8);
            auVar24._0_4_ = auVar24._4_4_;
            auVar24._8_4_ = auVar24._12_4_;
            auVar43 = pshuflw(auVar42,auVar24,0xe8);
            auVar23._8_4_ = 0xffffffff;
            auVar23._0_8_ = 0xffffffffffffffff;
            auVar23._12_4_ = 0xffffffff;
            auVar23 = (auVar43 | auVar44 & auVar42) ^ auVar23;
            auVar23 = packssdw(auVar23,auVar23);
            if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pUVar2[uVar12] = 0x400;
            }
            auVar24 = auVar26 & auVar33 | auVar24;
            auVar23 = packssdw(auVar24,auVar24);
            auVar43._8_4_ = 0xffffffff;
            auVar43._0_8_ = 0xffffffffffffffff;
            auVar43._12_4_ = 0xffffffff;
            auVar23 = packssdw(auVar23 ^ auVar43,auVar23 ^ auVar43);
            if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
              pUVar2[uVar12 + 1] = 0x400;
            }
            auVar23 = auVar20 ^ auVar45;
            iVar36 = -(uint)(iVar37 < auVar23._0_4_);
            auVar38._4_4_ = -(uint)(iVar8 < auVar23._4_4_);
            iVar40 = -(uint)(iVar41 < auVar23._8_4_);
            auVar38._12_4_ = -(uint)(iVar18 < auVar23._12_4_);
            auVar25._4_4_ = iVar36;
            auVar25._0_4_ = iVar36;
            auVar25._8_4_ = iVar40;
            auVar25._12_4_ = iVar40;
            auVar32._4_4_ = -(uint)(auVar23._4_4_ == iVar8);
            auVar32._12_4_ = -(uint)(auVar23._12_4_ == iVar18);
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            auVar38._0_4_ = auVar38._4_4_;
            auVar38._8_4_ = auVar38._12_4_;
            auVar23 = auVar32 & auVar25 | auVar38;
            auVar23 = packssdw(auVar23,auVar23);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar23 = packssdw(auVar23 ^ auVar4,auVar23 ^ auVar4);
            if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pUVar2[uVar12 + 2] = 0x400;
            }
            auVar26 = pshufhw(auVar25,auVar25,0x84);
            auVar33 = pshufhw(auVar32,auVar32,0x84);
            auVar24 = pshufhw(auVar26,auVar38,0x84);
            auVar27._8_4_ = 0xffffffff;
            auVar27._0_8_ = 0xffffffffffffffff;
            auVar27._12_4_ = 0xffffffff;
            auVar27 = (auVar24 | auVar33 & auVar26) ^ auVar27;
            auVar26 = packssdw(auVar27,auVar27);
            if ((auVar26 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pUVar2[uVar12 + 3] = 0x400;
            }
            auVar26 = auVar21 ^ auVar45;
            iVar36 = -(uint)(iVar37 < auVar26._0_4_);
            auVar29._4_4_ = -(uint)(iVar8 < auVar26._4_4_);
            iVar40 = -(uint)(iVar41 < auVar26._8_4_);
            auVar29._12_4_ = -(uint)(iVar18 < auVar26._12_4_);
            auVar34._4_4_ = iVar36;
            auVar34._0_4_ = iVar36;
            auVar34._8_4_ = iVar40;
            auVar34._12_4_ = iVar40;
            auVar23 = pshuflw(auVar23,auVar34,0xe8);
            auVar28._4_4_ = -(uint)(auVar26._4_4_ == iVar8);
            auVar28._12_4_ = -(uint)(auVar26._12_4_ == iVar18);
            auVar28._0_4_ = auVar28._4_4_;
            auVar28._8_4_ = auVar28._12_4_;
            in_XMM9 = pshuflw(auVar44 & auVar42,auVar28,0xe8);
            in_XMM9 = in_XMM9 & auVar23;
            auVar29._0_4_ = auVar29._4_4_;
            auVar29._8_4_ = auVar29._12_4_;
            auVar23 = pshuflw(auVar23,auVar29,0xe8);
            auVar42._8_4_ = 0xffffffff;
            auVar42._0_8_ = 0xffffffffffffffff;
            auVar42._12_4_ = 0xffffffff;
            auVar42 = (auVar23 | in_XMM9) ^ auVar42;
            auVar23 = packssdw(auVar42,auVar42);
            if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              pUVar2[uVar12 + 4] = 0x400;
            }
            auVar29 = auVar28 & auVar34 | auVar29;
            auVar23 = packssdw(auVar29,auVar29);
            auVar44._8_4_ = 0xffffffff;
            auVar44._0_8_ = 0xffffffffffffffff;
            auVar44._12_4_ = 0xffffffff;
            auVar23 = packssdw(auVar23 ^ auVar44,auVar23 ^ auVar44);
            if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              pUVar2[uVar12 + 5] = 0x400;
            }
            auVar23 = auVar22 ^ auVar45;
            iVar37 = -(uint)(iVar37 < auVar23._0_4_);
            auVar39._4_4_ = -(uint)(iVar8 < auVar23._4_4_);
            iVar41 = -(uint)(iVar41 < auVar23._8_4_);
            auVar39._12_4_ = -(uint)(iVar18 < auVar23._12_4_);
            auVar30._4_4_ = iVar37;
            auVar30._0_4_ = iVar37;
            auVar30._8_4_ = iVar41;
            auVar30._12_4_ = iVar41;
            auVar35._4_4_ = -(uint)(auVar23._4_4_ == iVar8);
            auVar35._12_4_ = -(uint)(auVar23._12_4_ == iVar18);
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            auVar39._0_4_ = auVar39._4_4_;
            auVar39._8_4_ = auVar39._12_4_;
            auVar23 = auVar35 & auVar30 | auVar39;
            auVar23 = packssdw(auVar23,auVar23);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            in_XMM8 = packssdw(auVar23 ^ auVar5,auVar23 ^ auVar5);
            if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              pUVar2[uVar12 + 6] = 0x400;
            }
            auVar23 = pshufhw(auVar30,auVar30,0x84);
            auVar24 = pshufhw(auVar35,auVar35,0x84);
            auVar26 = pshufhw(auVar23,auVar39,0x84);
            auVar31._8_4_ = 0xffffffff;
            auVar31._0_8_ = 0xffffffffffffffff;
            auVar31._12_4_ = 0xffffffff;
            auVar31 = (auVar26 | auVar24 & auVar23) ^ auVar31;
            auVar23 = packssdw(auVar31,auVar31);
            if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              pUVar2[uVar12 + 7] = 0x400;
            }
            uVar12 = uVar12 + 8;
            lVar10 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 8;
            auVar19._8_8_ = lVar10 + 8;
            lVar10 = auVar20._8_8_;
            auVar20._0_8_ = auVar20._0_8_ + 8;
            auVar20._8_8_ = lVar10 + 8;
            lVar10 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + 8;
            auVar21._8_8_ = lVar10 + 8;
            lVar10 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 8;
            auVar22._8_8_ = lVar10 + 8;
          } while (((ulong)(uVar6 + 0x700) | 0x38) != uVar12);
          p->reps[3] = 1;
          p->state = 0;
          p->reps[0] = 1;
          p->reps[1] = 1;
          p->reps[2] = 1;
          p->needInitState = 0;
        }
        uVar6 = p->tempBufSize;
        uVar12 = (ulong)uVar6;
        if (uVar12 == 0) {
          if (inSize < 0x14 || dicLimit <= uVar11) {
            EVar7 = LzmaDec_TryDummy(p,src,inSize);
            if (EVar7 == DUMMY_ERROR) {
              memcpy(buf,src,inSize);
              p->tempBufSize = (uint)inSize;
              *srcLen = *srcLen + inSize;
              pEVar15 = (ELzmaStatus *)0x0;
              EVar9 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_001a774f:
              *status = EVar9;
              bVar16 = false;
              pBVar14 = local_48;
            }
            else {
              bVar16 = true;
              pBVar14 = src;
              if (uVar11 < dicLimit) {
                pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
              }
              else {
                pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
                if (EVar7 != DUMMY_MATCH) {
                  pEVar15 = (ELzmaStatus *)0x1;
                  EVar9 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_001a774f;
                }
              }
            }
            if (bVar16) goto LAB_001a775f;
            bVar16 = false;
          }
          else {
            pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
            pBVar14 = src + (inSize - 0x14);
LAB_001a775f:
            p->buf = src;
            iVar37 = LzmaDec_DecodeReal2(p,dicLimit,pBVar14);
            if (iVar37 == 0) {
              pBVar3 = p->buf;
              lVar10 = (long)pBVar3 - (long)src;
              *srcLen = *srcLen + lVar10;
              inSize = inSize - lVar10;
              bVar16 = true;
              src = pBVar3;
            }
            else {
              pEVar15 = (ELzmaStatus *)0x1;
              bVar16 = false;
            }
          }
          auVar45 = _DAT_001b10b0;
          local_48 = pBVar14;
          if (!bVar16) {
            bVar16 = false;
            goto LAB_001a7801;
          }
        }
        else {
          iVar37 = 0;
          bVar16 = uVar6 < 0x14;
          if (bVar16) {
            uVar13 = 0;
            if (inSize != 0) {
              uVar13 = 0;
              do {
                pBVar14 = src + uVar13;
                uVar13 = uVar13 + 1;
                p->tempBuf[uVar12] = *pBVar14;
                bVar16 = uVar12 < 0x13;
                if (!bVar16) break;
                uVar12 = uVar12 + 1;
              } while (uVar13 < inSize);
              iVar37 = (int)uVar13;
              uVar12 = (ulong)(uVar6 + iVar37);
            }
          }
          else {
            uVar13 = 0;
          }
          p->tempBufSize = (uint)uVar12;
          if ((bool)(uVar11 < dicLimit & (bVar16 ^ 1U))) {
LAB_001a765b:
            p->buf = buf;
            iVar8 = LzmaDec_DecodeReal2(p,dicLimit,buf);
            bVar16 = iVar8 == 0;
            if (bVar16) {
              uVar11 = (ulong)((iVar37 - (uint)uVar12) + (*(int *)&p->buf - (int)buf));
              *srcLen = *srcLen + uVar11;
              src = src + uVar11;
              inSize = inSize - uVar11;
              p->tempBufSize = 0;
              pEVar15 = (ELzmaStatus *)(ulong)local_6c;
              auVar45 = _DAT_001b10b0;
            }
            else {
              pEVar15 = (ELzmaStatus *)0x1;
              auVar45 = _DAT_001b10b0;
            }
          }
          else {
            EVar7 = LzmaDec_TryDummy(p,buf,uVar12);
            if (EVar7 == DUMMY_ERROR) {
              *srcLen = *srcLen + uVar13;
              pEVar15 = (ELzmaStatus *)0x0;
              EVar9 = LZMA_STATUS_NEEDS_MORE_INPUT;
LAB_001a764a:
              auVar45 = _DAT_001b10b0;
              *status = EVar9;
              bVar16 = false;
            }
            else {
              bVar16 = true;
              auVar45 = _DAT_001b10b0;
              if (uVar11 < dicLimit) {
                pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
              }
              else {
                pEVar15 = (ELzmaStatus *)((ulong)pEVar15 & 0xffffffff);
                if (EVar7 != DUMMY_MATCH) {
                  pEVar15 = (ELzmaStatus *)0x1;
                  EVar9 = LZMA_STATUS_NOT_FINISHED;
                  goto LAB_001a764a;
                }
              }
            }
            if (bVar16) {
              local_6c = (uint)pEVar15;
              goto LAB_001a765b;
            }
            bVar16 = false;
          }
          if (!bVar16) goto LAB_001a7700;
        }
        bVar16 = true;
      }
      else {
        if ((p->remainLen == 0) && (p->code == 0)) {
          *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        }
        else {
          if (finishMode != LZMA_FINISH_ANY) {
            if (p->remainLen != 0) {
              *status = LZMA_STATUS_NOT_FINISHED;
              goto LAB_001a720e;
            }
            goto LAB_001a7219;
          }
          *status = LZMA_STATUS_NOT_FINISHED;
        }
LAB_001a770d:
        bVar16 = false;
        pEVar15 = (ELzmaStatus *)0x0;
      }
    }
    else {
      if (inSize != 0) {
        do {
          uVar6 = p->tempBufSize;
          if (4 < (ulong)uVar6) goto LAB_001a71a8;
          BVar1 = *src;
          src = src + 1;
          p->tempBufSize = uVar6 + 1;
          p->tempBuf[uVar6] = BVar1;
          *srcLen = *srcLen + 1;
          inSize = inSize - 1;
        } while (inSize != 0);
        inSize = 0;
      }
LAB_001a71a8:
      if (p->tempBufSize < 5) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        goto LAB_001a770d;
      }
      if (p->tempBuf[0] == '\0') {
        uVar6 = *(uint *)(p->tempBuf + 1);
        p->code = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
        p->range = 0xffffffff;
        p->needFlush = 0;
        p->tempBufSize = 0;
        goto LAB_001a71dd;
      }
LAB_001a720e:
      pEVar15 = (ELzmaStatus *)0x1;
LAB_001a7700:
      bVar16 = false;
    }
LAB_001a7801:
    if (!bVar16) {
      return (SRes)pEVar15;
    }
  } while( true );
}

Assistant:

SRes LzmaDec_DecodeToDic(CLzmaDec* p, SizeT dicLimit, const Byte* src, SizeT* srcLen,
                         ELzmaFinishMode finishMode, ELzmaStatus* status) {
  SizeT inSize = *srcLen;
  (*srcLen) = 0;
  LzmaDec_WriteRem(p, dicLimit);

  *status = LZMA_STATUS_NOT_SPECIFIED;

  while (p->remainLen != kMatchSpecLenStart) {
    int checkEndMarkNow;

    if (p->needFlush != 0) {
      for (; inSize > 0 && p->tempBufSize < RC_INIT_SIZE; (*srcLen)++, inSize--)
        p->tempBuf[p->tempBufSize++] = *src++;
      if (p->tempBufSize < RC_INIT_SIZE) {
        *status = LZMA_STATUS_NEEDS_MORE_INPUT;
        return SZ_OK;
      }
      if (p->tempBuf[0] != 0)
        return SZ_ERROR_DATA;

      LzmaDec_InitRc(p, p->tempBuf);
      p->tempBufSize = 0;
    }

    checkEndMarkNow = 0;
    if (p->dicPos >= dicLimit) {
      if (p->remainLen == 0 && p->code == 0) {
        *status = LZMA_STATUS_MAYBE_FINISHED_WITHOUT_MARK;
        return SZ_OK;
      }
      if (finishMode == LZMA_FINISH_ANY) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_OK;
      }
      if (p->remainLen != 0) {
        *status = LZMA_STATUS_NOT_FINISHED;
        return SZ_ERROR_DATA;
      }
      checkEndMarkNow = 1;
    }

    if (p->needInitState)
      LzmaDec_InitStateReal(p);

    if (p->tempBufSize == 0) {
      SizeT processed;
      const Byte* bufLimit;
      if (inSize < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, src, inSize);
        if (dummyRes == DUMMY_ERROR) {
          memcpy(p->tempBuf, src, inSize);
          p->tempBufSize = (unsigned)inSize;
          (*srcLen) += inSize;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
        bufLimit = src;
      } else
        bufLimit = src + inSize - LZMA_REQUIRED_INPUT_MAX;
      p->buf = src;
      if (LzmaDec_DecodeReal2(p, dicLimit, bufLimit) != 0)
        return SZ_ERROR_DATA;
      processed = (SizeT)(p->buf - src);
      (*srcLen) += processed;
      src += processed;
      inSize -= processed;
    } else {
      unsigned rem = p->tempBufSize, lookAhead = 0;
      while (rem < LZMA_REQUIRED_INPUT_MAX && lookAhead < inSize)
        p->tempBuf[rem++] = src[lookAhead++];
      p->tempBufSize = rem;
      if (rem < LZMA_REQUIRED_INPUT_MAX || checkEndMarkNow) {
        int dummyRes = LzmaDec_TryDummy(p, p->tempBuf, rem);
        if (dummyRes == DUMMY_ERROR) {
          (*srcLen) += lookAhead;
          *status = LZMA_STATUS_NEEDS_MORE_INPUT;
          return SZ_OK;
        }
        if (checkEndMarkNow && dummyRes != DUMMY_MATCH) {
          *status = LZMA_STATUS_NOT_FINISHED;
          return SZ_ERROR_DATA;
        }
      }
      p->buf = p->tempBuf;
      if (LzmaDec_DecodeReal2(p, dicLimit, p->buf) != 0)
        return SZ_ERROR_DATA;
      lookAhead -= (rem - (unsigned)(p->buf - p->tempBuf));
      (*srcLen) += lookAhead;
      src += lookAhead;
      inSize -= lookAhead;
      p->tempBufSize = 0;
    }
  }
  if (p->code == 0)
    *status = LZMA_STATUS_FINISHED_WITH_MARK;
  return (p->code == 0) ? SZ_OK : SZ_ERROR_DATA;
}